

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void t1_destroy_v2(opj_t1_t *p_t1)

{
  if (p_t1 != (opj_t1_t *)0x0) {
    mqc_destroy(p_t1->mqc);
    p_t1->mqc = (opj_mqc_t *)0x0;
    raw_destroy(p_t1->raw);
    p_t1->raw = (opj_raw_t *)0x0;
    if (p_t1->data != (int *)0x0) {
      free(p_t1->data);
      p_t1->data = (int *)0x0;
    }
    if (p_t1->flags != (flag_t *)0x0) {
      free(p_t1->flags);
      p_t1->flags = (flag_t *)0x0;
    }
    free(p_t1);
    return;
  }
  return;
}

Assistant:

void t1_destroy_v2(opj_t1_t *p_t1)
{
	if
		(! p_t1)
	{
		return;
	}

	/* destroy MQC and RAW handles */
	mqc_destroy(p_t1->mqc);
	p_t1->mqc = 00;
	raw_destroy(p_t1->raw);
	p_t1->raw = 00;
	if
		(p_t1->data)
	{
		opj_aligned_free(p_t1->data);
		p_t1->data = 00;
	}
	if
		(p_t1->flags)
	{
		opj_aligned_free(p_t1->flags);
		p_t1->flags = 00;
	}
	opj_free(p_t1);
}